

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_circles(rf_vec2 center1,float radius1,rf_vec2 center2,float radius2)

{
  double dVar1;
  float distance;
  float dy;
  float dx;
  _Bool collision;
  float radius2_local;
  float radius1_local;
  rf_vec2 center2_local;
  rf_vec2 center1_local;
  
  radius2_local = center2.x;
  center2_local.x = center1.x;
  radius1_local = center2.y;
  center2_local.y = center1.y;
  dVar1 = sqrt((double)((radius2_local - center2_local.x) * (radius2_local - center2_local.x) +
                       (radius1_local - center2_local.y) * (radius1_local - center2_local.y)));
  return (float)dVar1 <= radius1 + radius2;
}

Assistant:

bool rf_check_collision_circles(rf_vec2 center1, float radius1, rf_vec2 center2, float radius2)
{
    bool collision = false;

    float dx = center2.x - center1.x; // X distance between centers
    float dy = center2.y - center1.y; // Y distance between centers

    float distance = sqrt(dx * dx + dy * dy); // Distance between centers

    if (distance <= (radius1 + radius2)) collision = true;

    return collision;
}